

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QASMFile.cpp
# Opt level: O3

void __thiscall qclab::io::QASMFile::parse(QASMFile *this)

{
  char *pcVar1;
  value_type *pvVar2;
  char cVar3;
  int iVar4;
  string *delimiter;
  char *pcVar5;
  char *pcVar6;
  value_type *str_00;
  long lVar7;
  bool bVar8;
  char *pcVar9;
  string str;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  commands;
  string local_100;
  char *local_e0;
  ulong local_d8;
  char local_d0;
  undefined7 uStack_cf;
  string local_c0;
  QASMFile *local_a0;
  string *local_98;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_90;
  string local_88;
  string local_68;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_48;
  
  lVar7 = *(long *)this;
  if (((&this->field_0x20)[*(long *)(lVar7 + -0x18)] & 2) == 0) {
    local_98 = (string *)&this->qregName_;
    local_90 = &this->gateCommands_;
    bVar8 = false;
    local_a0 = this;
    do {
      local_e0 = &local_d0;
      local_d8 = 0;
      local_d0 = '\0';
      cVar3 = std::ios::widen((char)*(undefined8 *)(lVar7 + -0x18) + (char)this);
      std::getline<char,std::char_traits<char>,std::allocator<char>>
                ((istream *)this,(string *)&local_e0,cVar3);
      pcVar5 = local_e0;
      pcVar1 = local_e0 + local_d8;
      pcVar6 = local_e0;
      if (0 < (long)local_d8 >> 2) {
        pcVar6 = local_e0 + (local_d8 & 0xfffffffffffffffc);
        lVar7 = ((long)local_d8 >> 2) + 1;
        pcVar9 = local_e0 + 3;
        do {
          iVar4 = isspace((int)pcVar9[-3]);
          if (iVar4 != 0) {
            pcVar9 = pcVar9 + -3;
            goto LAB_00125d1a;
          }
          iVar4 = isspace((int)pcVar9[-2]);
          if (iVar4 != 0) {
            pcVar9 = pcVar9 + -2;
            goto LAB_00125d1a;
          }
          iVar4 = isspace((int)pcVar9[-1]);
          if (iVar4 != 0) {
            pcVar9 = pcVar9 + -1;
            goto LAB_00125d1a;
          }
          iVar4 = isspace((int)*pcVar9);
          if (iVar4 != 0) goto LAB_00125d1a;
          lVar7 = lVar7 + -1;
          pcVar9 = pcVar9 + 4;
        } while (1 < lVar7);
      }
      lVar7 = (long)pcVar1 - (long)pcVar6;
      if (lVar7 == 1) {
LAB_00125cf6:
        iVar4 = isspace((int)*pcVar6);
        pcVar9 = pcVar6;
        if (iVar4 == 0) {
          pcVar9 = pcVar1;
        }
LAB_00125d1a:
        pcVar6 = pcVar9 + 1;
        if (pcVar6 != pcVar1 && pcVar9 != pcVar1) {
          do {
            cVar3 = *pcVar6;
            iVar4 = isspace((int)cVar3);
            if (iVar4 == 0) {
              *pcVar9 = cVar3;
              pcVar9 = pcVar9 + 1;
            }
            pcVar6 = pcVar6 + 1;
            pcVar5 = local_e0;
          } while (pcVar6 != pcVar1);
        }
      }
      else {
        if (lVar7 == 2) {
LAB_00125ce5:
          iVar4 = isspace((int)*pcVar6);
          pcVar9 = pcVar6;
          if (iVar4 == 0) {
            pcVar6 = pcVar6 + 1;
            goto LAB_00125cf6;
          }
          goto LAB_00125d1a;
        }
        pcVar9 = pcVar1;
        if (lVar7 == 3) {
          iVar4 = isspace((int)*pcVar6);
          pcVar9 = pcVar6;
          if (iVar4 == 0) {
            pcVar6 = pcVar6 + 1;
            goto LAB_00125ce5;
          }
          goto LAB_00125d1a;
        }
      }
      this = local_a0;
      local_d8 = (long)pcVar9 - (long)pcVar5;
      *pcVar9 = '\0';
      if (local_d8 != 0) {
        delimiter = (string *)0x2;
        std::__cxx11::string::substr((ulong)&local_100,(ulong)&local_e0);
        iVar4 = std::__cxx11::string::compare((char *)&local_100);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_100._M_dataplus._M_p != &local_100.field_2) {
          operator_delete(local_100._M_dataplus._M_p,local_100.field_2._M_allocated_capacity + 1);
        }
        if (iVar4 != 0) {
          local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_c0,";","");
          split<std::__cxx11::string>(&local_48,(io *)&local_e0,&local_c0,delimiter);
          str_00 = local_48.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          pvVar2 = local_48.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
            operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
            str_00 = local_48.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            pvVar2 = local_48.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
          }
          for (; str_00 != pvVar2; str_00 = str_00 + 1) {
            if (bVar8) {
              bVar8 = true;
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::push_back(local_90,str_00);
            }
            else {
              std::__cxx11::string::substr((ulong)&local_100,(ulong)str_00);
              iVar4 = std::__cxx11::string::compare((char *)&local_100);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_100._M_dataplus._M_p != &local_100.field_2) {
                operator_delete(local_100._M_dataplus._M_p,
                                local_100.field_2._M_allocated_capacity + 1);
              }
              if (iVar4 == 0) {
                std::__cxx11::string::substr((ulong)&local_100,(ulong)str_00);
                std::__cxx11::string::operator=((string *)str_00,(string *)&local_100);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_100._M_dataplus._M_p != &local_100.field_2) {
                  operator_delete(local_100._M_dataplus._M_p,
                                  local_100.field_2._M_allocated_capacity + 1);
                }
                local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
                std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"[","");
                left_of(&local_100,str_00,&local_68);
                std::__cxx11::string::operator=(local_98,(string *)&local_100);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_100._M_dataplus._M_p != &local_100.field_2) {
                  operator_delete(local_100._M_dataplus._M_p,
                                  local_100.field_2._M_allocated_capacity + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_68._M_dataplus._M_p != &local_68.field_2) {
                  operator_delete(local_68._M_dataplus._M_p,
                                  local_68.field_2._M_allocated_capacity + 1);
                }
                local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
                std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"]","");
                left_of(&local_100,str_00,&local_88);
                iVar4 = read_value<int>(&local_100);
                this->nbQubits_ = iVar4;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_100._M_dataplus._M_p != &local_100.field_2) {
                  operator_delete(local_100._M_dataplus._M_p,
                                  local_100.field_2._M_allocated_capacity + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_88._M_dataplus._M_p != &local_88.field_2) {
                  operator_delete(local_88._M_dataplus._M_p,
                                  local_88.field_2._M_allocated_capacity + 1);
                }
                bVar8 = true;
              }
              else {
                bVar8 = false;
              }
            }
          }
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector(&local_48);
        }
      }
      if (local_e0 != &local_d0) {
        operator_delete(local_e0,CONCAT71(uStack_cf,local_d0) + 1);
      }
      lVar7 = *(long *)this;
    } while (((&this->field_0x20)[*(long *)(lVar7 + -0x18)] & 2) == 0);
  }
  return;
}

Assistant:

void QASMFile::parse() {

    bool hasQreg = false ;

    // loop over lines in file
    while ( not stream_.eof() ) {

      // new line + remove all whitespaces
      std::string str ;
      std::getline( stream_ , str ) ;
      str.erase( remove_if( str.begin() , str.end() , isspace ) , str.end() ) ;

      // skip blank and comment lines
      if ( str.length() < 1 ) { continue ; }
      if ( str.substr( 0 , 2 ) == "//" ) { continue ; }

      // split commands on this line
      auto commands = split< std::string >( str , ";" ) ;

      // parse commands
      for ( auto& command : commands ) {
        if ( !hasQreg ) {
          if ( command.substr( 0 , 4 ) == "qreg" ) {
            // set quantum register
            command = command.substr( 4 ) ;
            qregName_ = left_of( command , "[" ) ;
            nbQubits_ = read_value< int >( left_of( command , "]" ) ) ;
            hasQreg = true ;
          }
        } else {
          // read gates
          gateCommands_.push_back( command ) ;
        }
      }

    }

  }